

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O0

LCC_API_VIRTUALIZATION_DETAIL_conflict __thiscall
license::os::ExecutionEnvironment::virtualization_detail(ExecutionEnvironment *this)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_88 [8];
  string sys_vendor;
  undefined1 local_58 [8];
  string bios_vendor;
  string bios_description;
  LCC_API_VIRTUALIZATION_DETAIL_conflict result;
  ExecutionEnvironment *this_local;
  
  psVar2 = DmiInfo::bios_description_abi_cxx11_(&this->m_dmi_info);
  std::__cxx11::string::string((string *)(bios_vendor.field_2._M_local_buf + 8),(string *)psVar2);
  psVar2 = DmiInfo::bios_vendor_abi_cxx11_(&this->m_dmi_info);
  std::__cxx11::string::string((string *)local_58,(string *)psVar2);
  psVar2 = DmiInfo::sys_vendor_abi_cxx11_(&this->m_dmi_info);
  std::__cxx11::string::string((string *)local_88,(string *)psVar2);
  bios_description.field_2._12_4_ =
       find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                    *)vm_vendors_abi_cxx11_,(string *)((long)&bios_vendor.field_2 + 8));
  if (((bios_description.field_2._12_4_ == BARE_TO_METAL) &&
      (bios_description.field_2._12_4_ =
            find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                         *)vm_vendors_abi_cxx11_,(string *)local_58),
      bios_description.field_2._12_4_ == BARE_TO_METAL)) &&
     (bios_description.field_2._12_4_ =
           find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                        *)vm_vendors_abi_cxx11_,(string *)local_88),
     bios_description.field_2._12_4_ == BARE_TO_METAL)) {
    psVar2 = CpuInfo::vendor_abi_cxx11_(&this->m_cpu_info);
    bios_description.field_2._12_4_ =
         find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                      *)virtual_cpu_names_abi_cxx11_,psVar2);
    if (bios_description.field_2._12_4_ == BARE_TO_METAL) {
      psVar2 = CpuInfo::brand_abi_cxx11_(&this->m_cpu_info);
      bios_description.field_2._12_4_ =
           find_in_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LCC_API_VIRTUALIZATION_DETAIL>_>_>
                        *)virtual_cpu_names_abi_cxx11_,psVar2);
    }
  }
  if ((bios_description.field_2._12_4_ == 0) &&
     ((bVar1 = CpuInfo::is_hypervisor_set(&this->m_cpu_info), bVar1 ||
      (bVar1 = is_cloud(this), bVar1)))) {
    bios_description.field_2._12_4_ = 7;
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(bios_vendor.field_2._M_local_buf + 8));
  return bios_description.field_2._12_4_;
}

Assistant:

LCC_API_VIRTUALIZATION_DETAIL ExecutionEnvironment::virtualization_detail() const {
	LCC_API_VIRTUALIZATION_DETAIL result = BARE_TO_METAL;
	const string bios_description = m_dmi_info.bios_description();
	const string bios_vendor = m_dmi_info.bios_vendor();
	const string sys_vendor = m_dmi_info.sys_vendor();
	if ((result = find_in_map(vm_vendors, bios_description)) == BARE_TO_METAL) {
		if ((result = find_in_map(vm_vendors, bios_vendor)) == BARE_TO_METAL) {
			if ((result = find_in_map(vm_vendors, sys_vendor)) == BARE_TO_METAL) {
				if ((result = find_in_map(virtual_cpu_names, m_cpu_info.vendor())) == BARE_TO_METAL) {
					result = find_in_map(virtual_cpu_names, m_cpu_info.brand());
				}
			}
		}
	}
	if (result == BARE_TO_METAL) {
		if (m_cpu_info.is_hypervisor_set() || is_cloud()) {
			result = V_OTHER;
		}
	}
	return result;
}